

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spng.c
# Opt level: O0

int spng_get_option(spng_ctx *ctx,spng_option option,int *value)

{
  int *value_local;
  spng_option option_local;
  spng_ctx *ctx_local;
  
  if ((ctx == (spng_ctx *)0x0) || (value == (int *)0x0)) {
    ctx_local._4_4_ = 1;
  }
  else if (ctx->state == SPNG_STATE_INVALID) {
    ctx_local._4_4_ = 0x46;
  }
  else {
    switch(option) {
    case SPNG_KEEP_UNKNOWN_CHUNKS:
      *value = (uint)(*(ushort *)&ctx->field_0xcc >> 8 & 1);
      break;
    case SPNG_IMG_COMPRESSION_LEVEL:
      *value = (ctx->image_options).compression_level;
      break;
    case SPNG_IMG_WINDOW_BITS:
      *value = (ctx->image_options).window_bits;
      break;
    case SPNG_IMG_MEM_LEVEL:
      *value = (ctx->image_options).mem_level;
      break;
    case SPNG_IMG_COMPRESSION_STRATEGY:
      *value = (ctx->image_options).strategy;
      break;
    case SPNG_TEXT_COMPRESSION_LEVEL:
      *value = (ctx->text_options).compression_level;
      break;
    case SPNG_TEXT_WINDOW_BITS:
      *value = (ctx->text_options).window_bits;
      break;
    case SPNG_TEXT_MEM_LEVEL:
      *value = (ctx->text_options).mem_level;
      break;
    case SPNG_TEXT_COMPRESSION_STRATEGY:
      *value = (ctx->text_options).strategy;
      break;
    case SPNG_FILTER_CHOICE:
      *value = (ctx->encode_flags).filter_choice;
      break;
    case SPNG_CHUNK_COUNT_LIMIT:
      *value = ctx->chunk_count_limit;
      break;
    case SPNG_ENCODE_TO_BUFFER:
      if ((*(ushort *)&ctx->field_0xcc >> 1 & 1) == 0) {
        *value = 0;
      }
      else {
        *value = 1;
      }
      break;
    default:
      return 1;
    }
    ctx_local._4_4_ = 0;
  }
  return ctx_local._4_4_;
}

Assistant:

int spng_get_option(spng_ctx *ctx, enum spng_option option, int *value)
{
    if(ctx == NULL || value == NULL) return 1;
    if(!ctx->state) return SPNG_EBADSTATE;

    switch(option)
    {
        case SPNG_KEEP_UNKNOWN_CHUNKS:
        {
            *value = ctx->keep_unknown;
            break;
        }
        case SPNG_IMG_COMPRESSION_LEVEL:
        {
            *value = ctx->image_options.compression_level;
            break;
        }
            case SPNG_IMG_WINDOW_BITS:
        {
            *value = ctx->image_options.window_bits;
            break;
        }
        case SPNG_IMG_MEM_LEVEL:
        {
            *value = ctx->image_options.mem_level;
            break;
        }
        case SPNG_IMG_COMPRESSION_STRATEGY:
        {
            *value = ctx->image_options.strategy;
            break;
        }
        case SPNG_TEXT_COMPRESSION_LEVEL:
        {
            *value = ctx->text_options.compression_level;
            break;
        }
            case SPNG_TEXT_WINDOW_BITS:
        {
            *value = ctx->text_options.window_bits;
            break;
        }
        case SPNG_TEXT_MEM_LEVEL:
        {
            *value = ctx->text_options.mem_level;
            break;
        }
        case SPNG_TEXT_COMPRESSION_STRATEGY:
        {
            *value = ctx->text_options.strategy;
            break;
        }
        case SPNG_FILTER_CHOICE:
        {
            *value = ctx->encode_flags.filter_choice;
            break;
        }
        case SPNG_CHUNK_COUNT_LIMIT:
        {
            *value = ctx->chunk_count_limit;
            break;
        }
        case SPNG_ENCODE_TO_BUFFER:
        {
            if(ctx->internal_buffer) *value = 1;
            else *value = 0;

            break;
        }
        default: return 1;
    }

    return 0;
}